

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_undo(nk_text_edit *state)

{
  nk_rune *dst0;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined2 uVar6;
  int pos;
  undefined2 uVar7;
  short sVar8;
  nk_rune nVar9;
  long lVar10;
  ulong uVar11;
  int len;
  short *psVar12;
  int iVar13;
  int iVar14;
  
  lVar10 = (long)(state->undo).undo_point;
  if (lVar10 != 0) {
    pos = (state->undo).undo_rec[lVar10 + -1].where;
    sVar1 = (state->undo).undo_rec[lVar10 + -1].insert_length;
    sVar2 = (state->undo).undo_rec[lVar10 + -1].delete_length;
    len = (int)sVar2;
    sVar3 = (state->undo).undo_rec[lVar10 + -1].char_storage;
    uVar11 = (ulong)(state->undo).redo_point;
    (state->undo).undo_rec[uVar11 - 1].char_storage = -1;
    (state->undo).undo_rec[uVar11 - 1].insert_length = sVar2;
    (state->undo).undo_rec[uVar11 - 1].delete_length = sVar1;
    (state->undo).undo_rec[uVar11 - 1].where = pos;
    if (sVar2 != 0) {
      if ((state->undo).undo_char_point + len < 999) {
        while( true ) {
          sVar8 = (short)uVar11;
          iVar13 = (state->undo).undo_char_point + len;
          sVar4 = (state->undo).redo_char_point;
          if (iVar13 <= sVar4) break;
          if (0x62 < sVar8) goto LAB_001205e0;
          if (-1 < (state->undo).undo_rec[0x62].char_storage) {
            sVar5 = (state->undo).undo_rec[0x62].insert_length;
            sVar8 = sVar5 + sVar4;
            (state->undo).redo_char_point = sVar8;
            dst0 = (state->undo).undo_char + sVar8;
            nk_memcopy(dst0,dst0 + -(long)sVar5,999 - (long)sVar8);
            sVar8 = (state->undo).redo_point;
            lVar10 = (long)sVar8;
            psVar12 = &(state->undo).undo_rec[lVar10].char_storage;
            for (; lVar10 < 0x62; lVar10 = lVar10 + 1) {
              if (-1 < *psVar12) {
                *psVar12 = *psVar12 + sVar5;
              }
              psVar12 = psVar12 + 6;
            }
          }
          sVar8 = sVar8 + 1;
          (state->undo).redo_point = sVar8;
          if (sVar8 == 99) goto LAB_001205ea;
          lVar10 = (long)sVar8;
          nk_memcopy((state->undo).undo_rec + lVar10 + -1,(state->undo).undo_rec + lVar10,
                     (99 - lVar10) * 0xc);
          uVar11 = (ulong)(ushort)(state->undo).redo_point;
LAB_001205e0:
          if ((short)uVar11 == 99) goto LAB_001205ea;
        }
        psVar12 = &(state->undo).undo_rec[(long)sVar8 + -1].char_storage;
        *psVar12 = sVar4 - sVar2;
        (state->undo).redo_char_point = sVar4 - sVar2;
        lVar10 = 0;
        iVar14 = 0;
        if (0 < len) {
          iVar14 = len;
        }
        for (; iVar14 != (int)lVar10; lVar10 = lVar10 + 1) {
          nVar9 = nk_str_rune_at(&state->string,pos + (int)lVar10);
          (state->undo).undo_char[*psVar12 + lVar10] = nVar9;
        }
LAB_001205ea:
        if (sVar4 < iVar13) {
          return;
        }
        goto LAB_00120600;
      }
      (state->undo).undo_rec[uVar11 - 1].insert_length = 0;
LAB_00120600:
      nk_str_delete_runes(&state->string,pos,len);
    }
    if (sVar1 != 0) {
      nk_str_insert_text_runes(&state->string,pos,(state->undo).undo_char + sVar3,(int)sVar1);
      psVar12 = &(state->undo).undo_char_point;
      *psVar12 = *psVar12 - sVar1;
    }
    state->cursor = (int)(short)(sVar1 + (short)pos);
    uVar6 = (state->undo).undo_point;
    uVar7 = (state->undo).redo_point;
    (state->undo).undo_point = uVar6 + -1;
    (state->undo).redo_point = uVar7 + -1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_undo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record u, *r;
    if (s->undo_point == 0)
        return;

    /* we need to do two things: apply the undo record, and create a redo record */
    u = s->undo_rec[s->undo_point-1];
    r = &s->undo_rec[s->redo_point-1];
    r->char_storage = -1;

    r->insert_length = u.delete_length;
    r->delete_length = u.insert_length;
    r->where = u.where;

    if (u.delete_length)
    {
       /*   if the undo record says to delete characters, then the redo record will
            need to re-insert the characters that get deleted, so we need to store
            them.
            there are three cases:
                - there's enough room to store the characters
                - characters stored for *redoing* don't leave room for redo
                - characters stored for *undoing* don't leave room for redo
            if the last is true, we have to bail */
        if (s->undo_char_point + u.delete_length >= NK_TEXTEDIT_UNDOCHARCOUNT) {
            /* the undo records take up too much character space; there's no space
            * to store the redo characters */
            r->insert_length = 0;
        } else {
            int i;
            /* there's definitely room to store the characters eventually */
            while (s->undo_char_point + u.delete_length > s->redo_char_point) {
                /* there's currently not enough room, so discard a redo record */
                nk_textedit_discard_redo(s);
                /* should never happen: */
                if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
                    return;
            }

            r = &s->undo_rec[s->redo_point-1];
            r->char_storage = (short)(s->redo_char_point - u.delete_length);
            s->redo_char_point = (short)(s->redo_char_point -  u.delete_length);

            /* now save the characters */
            for (i=0; i < u.delete_length; ++i)
                s->undo_char[r->char_storage + i] =
                    nk_str_rune_at(&state->string, u.where + i);
        }
        /* now we can carry out the deletion */
        nk_str_delete_runes(&state->string, u.where, u.delete_length);
    }

    /* check type of recorded action: */
    if (u.insert_length) {
        /* easy case: was a deletion, so we need to insert n characters */
        nk_str_insert_text_runes(&state->string, u.where,
            &s->undo_char[u.char_storage], u.insert_length);
        s->undo_char_point = (short)(s->undo_char_point - u.insert_length);
    }
    state->cursor = (short)(u.where + u.insert_length);

    s->undo_point--;
    s->redo_point--;
}